

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<double>_>::EqnBackward
          (TPZEqnArray<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *U,
          DecomposeType dec)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  double dVar5;
  ulong uVar6;
  complex<double> *pcVar7;
  complex<double> *pcVar8;
  long lVar9;
  long lVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  double local_58;
  double dStack_50;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    uVar6 = (ulong)(uint)this->fNumEq;
    while (1 < (int)uVar6) {
      uVar1 = uVar6 - 2;
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar9 = (long)piVar3[uVar6 - 2];
      iVar2 = piVar3[uVar6 - 1];
      local_58 = 0.0;
      dStack_50 = 0.0;
      lVar4 = lVar9 * 0x10;
      lVar10 = lVar9;
      while( true ) {
        lVar10 = lVar10 + 1;
        piVar3 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        if (iVar2 <= lVar10) break;
        pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(U,(long)piVar3[lVar10],0);
        std::operator*(pcVar7,(complex<double> *)
                              ((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                               super_TPZVec<std::complex<double>_>.fStore[1]._M_value + lVar4));
        local_58 = local_58 - extraout_XMM0_Qa_00;
        dStack_50 = dStack_50 - in_XMM1_Qa;
        in_XMM1_Qa = local_58;
        lVar4 = lVar4 + 0x10;
      }
      pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(U,(long)piVar3[lVar9],0);
      dVar5 = *(double *)(pcVar7->_M_value + 8);
      in_XMM1_Qa = local_58 + *(double *)pcVar7->_M_value;
      *(double *)pcVar7->_M_value = in_XMM1_Qa;
      *(double *)(pcVar7->_M_value + 8) = dStack_50 + dVar5;
      uVar6 = uVar1;
      if ((dec & ~ELUPivot) == ELU) {
        pcVar7 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                 super_TPZVec<std::complex<double>_>.fStore;
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<double>::operator/=(pcVar8,pcVar7 + lVar9);
      }
    }
  }
  else if (this->fSymmetric == EIsSymmetric) {
    uVar6 = (ulong)(uint)this->fNumEq;
    while (0 < (int)uVar6) {
      uVar1 = uVar6 - 1;
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      lVar9 = (long)piVar3[uVar6 - 1];
      iVar2 = piVar3[uVar6];
      local_58 = 0.0;
      dStack_50 = 0.0;
      lVar4 = lVar9 * 0x10;
      lVar10 = lVar9;
      while( true ) {
        lVar10 = lVar10 + 1;
        piVar3 = (this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore;
        if (iVar2 <= lVar10) break;
        pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(U,(long)piVar3[lVar10],0);
        std::operator*(pcVar7,(complex<double> *)
                              ((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                               super_TPZVec<std::complex<double>_>.fStore[1]._M_value + lVar4));
        local_58 = local_58 - extraout_XMM0_Qa;
        dStack_50 = dStack_50 - in_XMM1_Qa;
        in_XMM1_Qa = local_58;
        lVar4 = lVar4 + 0x10;
      }
      pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(U,(long)piVar3[lVar9],0);
      dVar5 = *(double *)(pcVar7->_M_value + 8);
      in_XMM1_Qa = local_58 + *(double *)pcVar7->_M_value;
      *(double *)pcVar7->_M_value = in_XMM1_Qa;
      *(double *)(pcVar7->_M_value + 8) = dStack_50 + dVar5;
      uVar6 = uVar1;
      if (dec == ECholesky) {
        pcVar7 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                 super_TPZVec<std::complex<double>_>.fStore;
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                           (U,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<double>::operator/=(pcVar8,pcVar7 + lVar9);
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}